

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context.hpp
# Opt level: O3

void __thiscall
asio::io_context::basic_executor_type<std::allocator<void>,0ul>::
execute<asio::detail::binder0<std::function<void()>>>
          (basic_executor_type<std::allocator<void>,0ul> *this,binder0<std::function<void_()>_> *f)

{
  _Manager_type p_Var1;
  func_type p_Var2;
  long *plVar3;
  undefined8 uVar4;
  long in_FS_OFFSET;
  function_type tmp;
  _Any_data local_38;
  operation *poStack_28;
  _Invoker_type local_20;
  
  if ((*(ulong *)this & 1) == 0) {
    plVar3 = *(long **)(in_FS_OFFSET + -0x240);
    if (plVar3 != (long *)0x0) {
      do {
        if (*plVar3 == *(long *)((*(ulong *)this & 0xfffffffffffffffc) + 8)) {
          if (plVar3[1] != 0) {
            local_38._M_unused._M_object = (void *)0x0;
            local_38._8_8_ = 0;
            poStack_28 = (operation *)0x0;
            local_20 = (f->handler_)._M_invoker;
            p_Var1 = (f->handler_).super__Function_base._M_manager;
            if (p_Var1 != (_Manager_type)0x0) {
              local_38._M_unused._0_8_ =
                   (undefined8)*(undefined8 *)&(f->handler_).super__Function_base._M_functor;
              local_38._8_8_ =
                   *(undefined8 *)((long)&(f->handler_).super__Function_base._M_functor + 8);
              (f->handler_).super__Function_base._M_manager = (_Manager_type)0x0;
              (f->handler_)._M_invoker = (_Invoker_type)0x0;
              poStack_28 = (operation *)p_Var1;
            }
            if (poStack_28 != (operation *)0x0) {
              (*local_20)(&local_38);
              if (poStack_28 == (operation *)0x0) {
                return;
              }
              (*(code *)poStack_28)(&local_38,&local_38,__destroy_functor);
              return;
            }
            std::__throw_bad_function_call();
          }
          break;
        }
        plVar3 = (long *)plVar3[2];
      } while (plVar3 != (long *)0x0);
      goto LAB_001a70e8;
    }
  }
  else {
LAB_001a70e8:
    if (*(long *)(in_FS_OFFSET + -0x240) != 0) {
      uVar4 = *(undefined8 *)(*(long *)(in_FS_OFFSET + -0x240) + 8);
      goto LAB_001a7102;
    }
  }
  uVar4 = 0;
LAB_001a7102:
  local_38._M_unused._0_8_ = (undefined8)this;
  local_38._8_8_ =
       detail::thread_info_base::allocate<asio::detail::thread_info_base::default_tag>(uVar4,0x40,8)
  ;
  ((operation *)local_38._8_8_)->next_ = (scheduler_operation *)0x0;
  ((operation *)local_38._8_8_)->func_ =
       detail::
       executor_op<asio::detail::binder0<std::function<void_()>_>,_std::allocator<void>,_asio::detail::scheduler_operation>
       ::do_complete;
  ((operation *)local_38._8_8_)->task_result_ = 0;
  *(undefined8 *)&((operation *)(local_38._8_8_ + 0x18))->task_result_ = 0;
  ((operation *)(local_38._8_8_ + 0x18))->next_ = (scheduler_operation *)0x0;
  ((operation *)(local_38._8_8_ + 0x18))->func_ = (func_type)0x0;
  ((operation *)(local_38._8_8_ + 0x30))->next_ = (scheduler_operation *)(f->handler_)._M_invoker;
  if ((f->handler_).super__Function_base._M_manager != (_Manager_type)0x0) {
    p_Var2 = *(func_type *)((long)&(f->handler_).super__Function_base._M_functor + 8);
    ((operation *)(local_38._8_8_ + 0x18))->next_ =
         *(scheduler_operation **)&(f->handler_).super__Function_base._M_functor;
    ((operation *)(local_38._8_8_ + 0x18))->func_ = p_Var2;
    *(_Manager_type *)&((operation *)(local_38._8_8_ + 0x18))->task_result_ =
         (f->handler_).super__Function_base._M_manager;
    (f->handler_).super__Function_base._M_manager = (_Manager_type)0x0;
    (f->handler_)._M_invoker = (_Invoker_type)0x0;
  }
  poStack_28 = (operation *)local_38._8_8_;
  detail::scheduler::post_immediate_completion
            (*(scheduler **)((*(ulong *)this & 0xfffffffffffffffc) + 8),(operation *)local_38._8_8_,
             SUB41(((uint)*(ulong *)this & 2) >> 1,0));
  local_38._8_8_ = 0;
  poStack_28 = (operation *)0x0;
  detail::
  executor_op<asio::detail::binder0<std::function<void_()>_>,_std::allocator<void>,_asio::detail::scheduler_operation>
  ::ptr::reset((ptr *)&local_38);
  return;
}

Assistant:

void io_context::basic_executor_type<Allocator, Bits>::execute(
    ASIO_MOVE_ARG(Function) f) const
{
  typedef typename decay<Function>::type function_type;

  // Invoke immediately if the blocking.possibly property is enabled and we are
  // already inside the thread pool.
  if ((bits() & blocking_never) == 0 && context_ptr()->impl_.can_dispatch())
  {
    // Make a local, non-const copy of the function.
    function_type tmp(ASIO_MOVE_CAST(Function)(f));

#if defined(ASIO_HAS_STD_EXCEPTION_PTR) \
  && !defined(ASIO_NO_EXCEPTIONS)
    try
    {
#endif // defined(ASIO_HAS_STD_EXCEPTION_PTR)
       //   && !defined(ASIO_NO_EXCEPTIONS)
      detail::fenced_block b(detail::fenced_block::full);
      asio_handler_invoke_helpers::invoke(tmp, tmp);
      return;
#if defined(ASIO_HAS_STD_EXCEPTION_PTR) \
  && !defined(ASIO_NO_EXCEPTIONS)
    }
    catch (...)
    {
      context_ptr()->impl_.capture_current_exception();
      return;
    }
#endif // defined(ASIO_HAS_STD_EXCEPTION_PTR)
       //   && !defined(ASIO_NO_EXCEPTIONS)
  }

  // Allocate and construct an operation to wrap the function.
  typedef detail::executor_op<function_type, Allocator, detail::operation> op;
  typename op::ptr p = {
      detail::addressof(static_cast<const Allocator&>(*this)),
      op::ptr::allocate(static_cast<const Allocator&>(*this)), 0 };
  p.p = new (p.v) op(ASIO_MOVE_CAST(Function)(f),
      static_cast<const Allocator&>(*this));

  ASIO_HANDLER_CREATION((*context_ptr(), *p.p,
        "io_context", context_ptr(), 0, "execute"));

  context_ptr()->impl_.post_immediate_completion(p.p,
      (bits() & relationship_continuation) != 0);
  p.v = p.p = 0;
}